

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_beginend.c
# Opt level: O0

_Bool test_with_epoxy(void)

{
  int iVar1;
  
  (*_epoxy_glBegin)(4);
  (*_epoxy_glVertex2f)(0);
  (*_epoxy_glMultiTexCoord4f)(0,0,0,0x84c0);
  if ((has_argb2101010 & 1U) != 0) {
    (*_epoxy_glTexCoordP4ui)(0x8368,0);
  }
  (*_epoxy_glEnd)();
  iVar1 = (*_epoxy_glGetError)();
  return iVar1 == 0;
}

Assistant:

static bool
test_with_epoxy(void)
{
    glBegin(GL_TRIANGLES);
    {
        /* Hit a base entrypoint that won't call gl_version() */
        glVertex2f(0, 0);

        /* Hit an entrypoint that will call probably call gl_version() */
        glMultiTexCoord4f(GL_TEXTURE0, 0.0, 0.0, 0.0, 0.0);

        /* Hit an entrypoint that will probably call
         * epoxy_conservative_has_extension();
         */
        if (has_argb2101010) {
            glTexCoordP4ui(GL_UNSIGNED_INT_2_10_10_10_REV, 0);
        }
    }
    glEnd();

    /* No error should have been generated in the process. */
    return glGetError() == 0;
}